

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RasterizerCells.cpp
# Opt level: O0

void __thiscall TRM::RasterizerCells::reset(RasterizerCells *this)

{
  int iVar1;
  RasterizerCells *this_local;
  
  this->m_num_cells = 0;
  this->m_curr_block = 0;
  Cell::initial(&this->m_curr_cell);
  std::vector<TRM::Cell,_std::allocator<TRM::Cell>_>::clear(&this->m_cells);
  iVar1 = std::numeric_limits<int>::max();
  this->m_min_x = iVar1;
  iVar1 = std::numeric_limits<int>::max();
  this->m_min_y = iVar1;
  iVar1 = std::numeric_limits<int>::min();
  this->m_max_x = iVar1;
  iVar1 = std::numeric_limits<int>::min();
  this->m_max_y = iVar1;
  this->m_sorted = false;
  return;
}

Assistant:

void RasterizerCells::reset() {
  m_num_cells = 0;
  m_curr_block = 0;
  m_curr_cell.initial();
  m_cells.clear();
  m_min_x = std::numeric_limits<int32_t>::max();
  m_min_y = std::numeric_limits<int32_t>::max();
  m_max_x = std::numeric_limits<int32_t>::min();
  m_max_y = std::numeric_limits<int32_t>::min();
  m_sorted = false;
}